

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<long,(char)44>
               (char *string_ptr,idx_t string_size,long *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  char cVar1;
  bool bVar2;
  IntegerCastData<short> *pIVar3;
  uint uVar4;
  IntegerCastData<short> *pIVar5;
  IntegerCastData<short> *pIVar6;
  uint uVar7;
  IntegerCastData<short> *pIVar8;
  char *pcVar9;
  byte bVar10;
  duckdb *pdVar11;
  byte bVar12;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  byte bVar13;
  bool bVar14;
  IntegerCastData<short> *in_R10;
  ulong uVar15;
  IntegerCastData<short> *pIVar16;
  undefined7 uVar17;
  IntegerCastData<short> *pIVar18;
  IntegerCastData<short> *pIVar19;
  uint params_1;
  string error;
  DecimalCastData<long> local_e0;
  IntegerCastData<short> *local_c8;
  IntegerCastData<short> *local_c0;
  long *local_b8;
  IntegerCastData<short> *local_b0;
  string local_a8;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  CastParameters *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_e0.result = 0;
  local_e0.digit_count = '\0';
  local_e0.decimal_count = '\0';
  local_e0.round_set = false;
  local_e0.should_round = false;
  local_e0.excessive_decimals = '\0';
  local_e0.exponent_type = NONE;
  local_e0.limit =
       *(StoreType_conflict1 *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  uVar7 = (uint)width;
  params_1 = (uint)scale;
  local_e0.width = width;
  local_e0.scale = scale;
  local_78 = parameters;
  if (string_size != 0) {
    pIVar8 = (IntegerCastData<short> *)0x0;
    do {
      bVar12 = string_ptr[(long)pIVar8];
      uVar4 = (uint)bVar12;
      if ((4 < uVar4 - 9) && (uVar4 != 0x20)) {
        if (uVar4 == 0x2d) {
          if ((IntegerCastData<short> *)(string_size - 1) != pIVar8) {
            pIVar3 = (IntegerCastData<short> *)(string_size - (long)pIVar8);
            pIVar5 = (IntegerCastData<short> *)&DAT_00000001;
            local_e0._10_4_ = 0;
            local_e0.result = 0;
            goto LAB_002ab4b8;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_e0);
          break;
        }
        if (bVar12 == 0x30 && (IntegerCastData<short> *)(string_size - 1) != pIVar8) {
          bVar13 = (string_ptr + 1)[(long)pIVar8];
          if (bVar13 < 0x62) {
            if ((bVar13 != 0x42) && (bVar13 != 0x58)) goto LAB_002ab591;
          }
          else if ((bVar13 != 0x62) && (bVar13 != 0x78)) goto LAB_002ab591;
          if ((string_size - (long)pIVar8) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_002ab591:
          pIVar3 = (IntegerCastData<short> *)(string_size - (long)pIVar8);
          pIVar5 = (IntegerCastData<short> *)(ulong)(bVar12 == 0x2b);
          if (pIVar5 < pIVar3) {
            local_e0._10_4_ = 0;
            local_e0.result = 0;
            pIVar6 = pIVar5;
            pIVar16 = pIVar5;
            goto LAB_002ab5c1;
          }
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_e0);
        break;
      }
      pIVar8 = (IntegerCastData<short> *)((long)&pIVar8->result + 1);
    } while ((IntegerCastData<short> *)string_size != pIVar8);
    goto LAB_002ab67c;
  }
  local_88 = 0;
  goto LAB_002ab6b4;
  while( true ) {
    if (((undefined1 *)((long)&pIVar8->result + 1))[(long)(string_ptr + (long)&pIVar5->result)] ==
        '_') {
      if ((IntegerCastData<short> *)((string_size - (long)pIVar5) + -2) == pIVar8)
      goto LAB_002ab672;
      pIVar5 = pIVar5 + 1;
      bVar13 = (string_ptr + (long)pIVar5)[(long)&pIVar8->result] - 0x30;
      in_R10 = (IntegerCastData<short> *)
               CONCAT71((int7)((ulong)(string_ptr + (long)pIVar5) >> 8),bVar13);
      if (9 < bVar13) goto LAB_002ab672;
    }
    else {
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
    }
    pIVar18 = pIVar5;
    if (pIVar3 <= pIVar5) break;
LAB_002ab4b8:
    bVar12 = (byte)local_e0._10_4_;
    cVar1 = (string_ptr + (long)&pIVar5->result)[(long)&pIVar8->result];
    uVar15 = CONCAT71((int7)((ulong)in_R10 >> 8),cVar1);
    uVar4 = (uint)uVar15;
    bVar13 = (byte)(uVar4 - 0x30);
    if (9 < bVar13) {
      pIVar6 = pIVar5;
      if (cVar1 != ',') goto LAB_002aba17;
      pIVar16 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
      pIVar18 = pIVar16;
      if (pIVar3 <= pIVar16) goto LAB_002abae7;
      bVar2 = false;
      local_c8 = (IntegerCastData<short> *)((ulong)local_c8 & 0xffffffff00000000);
      bVar13 = 0;
      pIVar6 = pIVar16;
      goto LAB_002ab7cf;
    }
    if (bVar13 == 0 && local_e0.result == 0) {
      local_e0.result = 0;
    }
    else {
      if (uVar7 - params_1 == local_e0._10_4_) goto LAB_002ab672;
      bVar12 = bVar12 + 1;
      local_e0._10_4_ = ZEXT14(bVar12);
      if (local_e0.result < -0xccccccccccccccc) goto LAB_002ab672;
      local_e0.result = local_e0.result * 10 - (ulong)(uVar4 - 0x30 & 0xff);
    }
    bVar12 = (byte)local_e0._10_4_;
    in_R10 = (IntegerCastData<short> *)(~(ulong)pIVar5 + string_size);
    pIVar18 = pIVar3;
    if (in_R10 == pIVar8) break;
  }
LAB_002ab88c:
  local_b8 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_e0);
  if ((bVar2) && ((IntegerCastData<short> *)&DAT_00000001 < pIVar18)) goto LAB_002ab9d5;
  goto LAB_002ab67c;
  while( true ) {
    if (((undefined1 *)((long)&pIVar8->result + 1))[(long)(string_ptr + (long)pIVar6)] == '_') {
      if (((IntegerCastData<short> *)((string_size - (long)pIVar6) + -2) == pIVar8) ||
         (pIVar6 = pIVar6 + 1,
         9 < (byte)((string_ptr + (long)pIVar6)[(long)&pIVar8->result] - 0x30U))) {
        local_e0.decimal_count = bVar13;
        local_e0.digit_count = bVar12;
        local_e0.round_set = SUB81(local_c8,0);
        goto LAB_002abc44;
      }
    }
    else {
      pIVar6 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
    }
    pIVar18 = pIVar6;
    if (pIVar3 <= pIVar6) break;
LAB_002ab7cf:
    uVar17 = (undefined7)(uVar15 >> 8);
    uVar4 = (uint)CONCAT71(uVar17,(string_ptr + (long)pIVar6)[(long)&pIVar8->result]);
    bVar10 = (byte)(uVar4 - 0x30);
    local_c0 = pIVar16;
    if (9 < bVar10) {
      local_e0.decimal_count = bVar13;
      local_e0.digit_count = bVar12;
      local_e0.round_set = local_c8._0_1_;
      local_e0.should_round = bVar2;
      local_b8 = result;
      if (pIVar16 < pIVar6 || (IntegerCastData<short> *)&DAT_00000001 < pIVar5) goto LAB_002aba17;
      goto LAB_002ab67c;
    }
    if ((bVar13 == scale) && (local_c8._0_1_ == false)) {
      bVar2 = 4 < bVar10;
      local_c8 = (IntegerCastData<short> *)CONCAT44(local_c8._4_4_,(int)CONCAT71(uVar17,1));
    }
    uVar15 = (ulong)((uint)bVar13 + local_e0._10_4_);
    if ((uint)bVar13 + local_e0._10_4_ < 0x12) {
      bVar13 = bVar13 + 1;
      local_e0.result = local_e0.result * 10 - (ulong)(uVar4 - 0x30 & 0xff);
    }
    pIVar18 = pIVar3;
    if ((IntegerCastData<short> *)(~(ulong)pIVar6 + string_size) == pIVar8) break;
  }
  local_e0.decimal_count = bVar13;
  local_e0.digit_count = bVar12;
  local_e0.round_set = SUB81(local_c8,0);
  local_e0.should_round = bVar2;
LAB_002abae7:
  if (((IntegerCastData<short> *)&DAT_00000001 < pIVar5) || (local_b8 = result, pIVar16 < pIVar18))
  goto LAB_002ab88c;
  goto LAB_002ab67c;
LAB_002aba17:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    local_b8 = result;
    if (uVar4 - 9 < 5) {
LAB_002aba2c:
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
      pIVar18 = pIVar5;
      if (pIVar5 < pIVar3) {
        do {
          if ((4 < (byte)(string_ptr + (long)pIVar5)[(long)&pIVar8->result] - 9) &&
             (local_b8 = result, (string_ptr + (long)pIVar5)[(long)&pIVar8->result] != 0x20))
          goto LAB_002ab67c;
          pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
          pIVar18 = pIVar3;
        } while (pIVar3 != pIVar5);
      }
      goto LAB_002ab88c;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    local_b8 = result;
    if ((pIVar6 != (IntegerCastData<short> *)&DAT_00000001) &&
       (pIVar5 = (IntegerCastData<short> *)((long)&pIVar6->result + 1), pIVar5 < pIVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pdVar11 = (duckdb *)(string_ptr + (long)pIVar6 + (long)((long)&pIVar8->result + 1));
      pcVar9 = (char *)(~(ulong)pIVar8 + (string_size - (long)pIVar6));
      if (*pdVar11 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar11,pcVar9,(idx_t)&local_a8,pIVar5,(bool)bVar12);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar11,pcVar9,(idx_t)&local_a8,pIVar5,(bool)bVar12);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                          (&local_e0,(int)(short)local_a8._M_dataplus._M_p);
        goto LAB_002abc96;
      }
    }
  }
  else {
    local_b8 = result;
    if (uVar4 == 0x20) goto LAB_002aba2c;
  }
  goto LAB_002ab67c;
  while( true ) {
    if (((undefined1 *)((long)&pIVar8->result + 1))[(long)(string_ptr + (long)&pIVar6->result)] ==
        '_') {
      if ((IntegerCastData<short> *)((string_size - (long)pIVar6) + -2) == pIVar8)
      goto LAB_002ab672;
      pIVar6 = pIVar6 + 1;
      bVar13 = (string_ptr + (long)pIVar6)[(long)&pIVar8->result] - 0x30;
      pIVar16 = (IntegerCastData<short> *)
                CONCAT71((int7)((ulong)(string_ptr + (long)pIVar6) >> 8),bVar13);
      if (9 < bVar13) goto LAB_002ab672;
    }
    else {
      pIVar6 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
    }
    pIVar19 = pIVar6;
    if (pIVar3 <= pIVar6) break;
LAB_002ab5c1:
    bVar12 = (byte)local_e0._10_4_;
    cVar1 = (string_ptr + (long)&pIVar6->result)[(long)&pIVar8->result];
    uVar15 = CONCAT71((int7)((ulong)pIVar16 >> 8),cVar1);
    uVar4 = (uint)uVar15;
    bVar13 = (byte)(uVar4 - 0x30);
    local_c8 = pIVar5;
    if (9 < bVar13) {
      pIVar16 = pIVar6;
      if (cVar1 != ',') goto LAB_002abb49;
      pIVar18 = (IntegerCastData<short> *)((long)&pIVar6->result + 1);
      pIVar19 = pIVar18;
      if (pIVar3 <= pIVar18) goto LAB_002abc1a;
      local_c0 = (IntegerCastData<short> *)((ulong)local_c0 & 0xffffffff00000000);
      bVar14 = false;
      bVar13 = 0;
      pIVar16 = pIVar18;
      goto LAB_002ab8f8;
    }
    if (bVar13 == 0 && local_e0.result == 0) {
      local_e0.result = 0;
    }
    else {
      if (uVar7 - params_1 == local_e0._10_4_) goto LAB_002ab672;
      bVar12 = bVar12 + 1;
      local_e0._10_4_ = ZEXT14(bVar12);
      if (0xccccccccccccccc < local_e0.result) goto LAB_002ab672;
      local_e0.result = (ulong)(uVar4 - 0x30 & 0xff) + local_e0.result * 10;
    }
    bVar12 = (byte)local_e0._10_4_;
    pIVar16 = (IntegerCastData<short> *)(~(ulong)pIVar6 + string_size);
    pIVar19 = pIVar3;
    if (pIVar16 == pIVar8) break;
  }
LAB_002ab9b3:
  local_b8 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_e0);
  if ((bVar2) && (local_c8 < pIVar19)) {
LAB_002ab9d5:
    *local_b8 = local_e0.result;
    return true;
  }
  goto LAB_002ab67c;
LAB_002abb49:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    local_b8 = result;
    if (uVar4 - 9 < 5) {
LAB_002abb5e:
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar16->result + 1);
      pIVar19 = pIVar5;
      if (pIVar5 < pIVar3) {
        do {
          if ((4 < (byte)(string_ptr + (long)pIVar5)[(long)&pIVar8->result] - 9) &&
             (local_b8 = result, (string_ptr + (long)pIVar5)[(long)&pIVar8->result] != 0x20))
          goto LAB_002ab67c;
          pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
          pIVar19 = pIVar3;
        } while (pIVar3 != pIVar5);
      }
      goto LAB_002ab9b3;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    local_b8 = result;
    if ((pIVar16 != pIVar5) &&
       (pIVar5 = (IntegerCastData<short> *)((long)&pIVar16->result + 1), pIVar5 < pIVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pdVar11 = (duckdb *)(string_ptr + (long)pIVar16 + (long)((long)&pIVar8->result + 1));
      pcVar9 = (char *)(~(ulong)pIVar8 + (string_size - (long)pIVar16));
      if (*pdVar11 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar11,pcVar9,(idx_t)&local_a8,pIVar5,(bool)bVar12);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar11,pcVar9,(idx_t)&local_a8,pIVar5,(bool)bVar12);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                          (&local_e0,(int)(short)local_a8._M_dataplus._M_p);
LAB_002abc96:
        if (bVar2 != false) goto LAB_002ab9d5;
      }
    }
  }
  else {
    local_b8 = result;
    if (uVar4 == 0x20) goto LAB_002abb5e;
  }
  goto LAB_002ab67c;
LAB_002ab672:
  local_e0._11_3_ = 0;
  local_e0.digit_count = bVar12;
  local_b8 = result;
  goto LAB_002ab67c;
LAB_002ab8f8:
  do {
    uVar17 = (undefined7)(uVar15 >> 8);
    uVar4 = (uint)CONCAT71(uVar17,(string_ptr + (long)pIVar16)[(long)&pIVar8->result]);
    bVar10 = (byte)(uVar4 - 0x30);
    local_b0 = pIVar18;
    if (9 < bVar10) {
      local_e0.decimal_count = bVar13;
      local_e0.digit_count = bVar12;
      local_e0.round_set = bVar14;
      local_e0.should_round = (bool)(char)local_c0;
      local_b8 = result;
      if (pIVar18 < pIVar16 || pIVar5 < pIVar6) goto LAB_002abb49;
      goto LAB_002ab67c;
    }
    if ((bVar13 == scale) && (bVar14 == false)) {
      local_c0 = (IntegerCastData<short> *)CONCAT44(local_c0._4_4_,(int)CONCAT71(uVar17,4 < bVar10))
      ;
      bVar14 = true;
    }
    uVar15 = (ulong)((uint)bVar13 + local_e0._10_4_);
    if ((uint)bVar13 + local_e0._10_4_ < 0x12) {
      bVar13 = bVar13 + 1;
      local_e0.result = (ulong)(uVar4 - 0x30 & 0xff) + local_e0.result * 10;
    }
    bVar2 = SUB81(local_c0,0);
    pIVar19 = pIVar3;
    if ((IntegerCastData<short> *)(~(ulong)pIVar16 + string_size) == pIVar8) break;
    if (((undefined1 *)((long)&pIVar8->result + 1))[(long)(string_ptr + (long)pIVar16)] == '_') {
      if (((IntegerCastData<short> *)((string_size - (long)pIVar16) + -2) != pIVar8) &&
         (pIVar16 = pIVar16 + 1,
         (byte)((string_ptr + (long)pIVar16)[(long)&pIVar8->result] - 0x30U) < 10))
      goto LAB_002ab995;
      local_e0.decimal_count = bVar13;
      local_e0.digit_count = bVar12;
      local_e0.round_set = bVar14;
LAB_002abc44:
      local_e0.should_round = bVar2;
      local_e0.digit_count = local_e0.digit_count;
      local_e0.decimal_count = local_e0.decimal_count;
      local_e0.round_set = local_e0.round_set;
      local_b8 = result;
      goto LAB_002ab67c;
    }
    pIVar16 = (IntegerCastData<short> *)((long)&pIVar16->result + 1);
LAB_002ab995:
    pIVar19 = pIVar16;
  } while (pIVar16 < pIVar3);
  local_e0.decimal_count = bVar13;
  local_e0.digit_count = bVar12;
  local_e0.round_set = bVar14;
  local_e0.should_round = bVar2;
LAB_002abc1a:
  if ((pIVar5 < pIVar6) || (local_b8 = result, pIVar18 < pIVar19)) goto LAB_002ab9b3;
LAB_002ab67c:
  local_88 = (uint)string_size;
  if (local_88 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (local_88 == 0) {
LAB_002ab6b4:
      uStack_80._4_4_ = 0;
      uStack_80._0_4_ = 0;
      uStack_84 = 0;
      string_size = 0;
    }
    else {
      switchD_00b03519::default(&uStack_84,string_ptr,(ulong)(local_88 & 0xf));
    }
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_a8,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar7,
             params_1,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_a8,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}